

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collate.cpp
# Opt level: O2

string * __thiscall
booster::locale::impl_std::utf8_collator_from_wide::do_transform_abi_cxx11_
          (string *__return_storage_ptr__,utf8_collator_from_wide *this,char *b,char *e)

{
  collate *pcVar1;
  char cVar2;
  uint uVar3;
  wstring wkey;
  wstring tmp;
  allocator local_69;
  string local_68;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_48;
  
  std::__cxx11::string::string((string *)&local_68,"UTF-8",&local_69);
  conv::to_utf<wchar_t>(&local_48,b,e,&local_68,default_method);
  std::__cxx11::string::~string((string *)&local_68);
  pcVar1 = std::use_facet<std::__cxx11::collate<wchar_t>>(&this->base_);
  (**(code **)(*(long *)pcVar1 + 0x18))
            (&local_68,pcVar1,local_48._M_dataplus._M_p,
             local_48._M_dataplus._M_p + local_48._M_string_length);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  for (uVar3 = 0; uVar3 < local_68._M_string_length; uVar3 = uVar3 + 1) {
    cVar2 = (char)__return_storage_ptr__;
    std::__cxx11::string::push_back(cVar2);
    std::__cxx11::string::push_back(cVar2);
    std::__cxx11::string::push_back(cVar2);
  }
  std::__cxx11::wstring::~wstring((wstring *)&local_68);
  std::__cxx11::wstring::~wstring((wstring *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string do_transform(char const *b,char const *e) const
    {
        std::wstring tmp=conv::to_utf<wchar_t>(b,e,"UTF-8");
        std::wstring wkey = 
            std::use_facet<wfacet>(base_).transform(tmp.c_str(),tmp.c_str()+tmp.size());
        std::string key;
        if(sizeof(wchar_t)==2)
            key.reserve(wkey.size()*2);
        else
            key.reserve(wkey.size()*3);
        for(unsigned i=0;i<wkey.size();i++) {
            if(sizeof(wchar_t)==2) {
                uint16_t tv = static_cast<uint16_t>(wkey[i]);
                key += char(tv >> 8);
                key += char(tv & 0xFF);
            }
            else { // 4
                uint32_t tv = static_cast<uint32_t>(wkey[i]);
                // 21 bit
                key += char((tv >> 16) & 0xFF);
                key += char((tv >> 8) & 0xFF);
                key += char(tv & 0xFF);
            }
        }
        return key;
    }